

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderHeatmap<short,ImPlot::TransformerLinLin>
               (TransformerLinLin transformer,ImDrawList *DrawList,short *values,int rows,int cols,
               double scale_min,double scale_max,char *fmt,ImPlotPoint *bounds_min,
               ImPlotPoint *bounds_max)

{
  ImVec2 IVar1;
  double dVar2;
  ImPlotPlot *pIVar3;
  ImPlotContext *pIVar4;
  short *psVar5;
  ImU32 col;
  int iVar6;
  ImPlotContext *gp;
  long lVar7;
  int iVar8;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  ImVec4 IVar19;
  ImVec2 a;
  ImVec2 b;
  ImVec4 color;
  ImVec2 local_f8;
  double local_f0;
  short *local_e8;
  ImDrawList *local_e0;
  char *local_d8;
  ulong local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double dStack_b0;
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  ImVec2 local_80;
  double local_78;
  double dStack_70;
  undefined1 local_68 [16];
  undefined1 local_58 [12];
  float fStack_4c;
  
  pIVar4 = GImPlot;
  if (0 < rows) {
    auVar13._0_8_ = (double)cols;
    auVar13._8_8_ = (double)rows;
    auVar12._0_8_ = bounds_max->x - bounds_min->x;
    auVar12._8_8_ = bounds_max->y - bounds_min->y;
    auVar13 = divpd(auVar12,auVar13);
    dVar11 = auVar13._0_8_;
    dVar14 = dVar11 * 0.5;
    local_78 = auVar13._8_8_;
    dVar15 = local_78 * 0.5;
    dVar9 = scale_max - scale_min;
    local_d0 = (ulong)(uint)cols;
    iVar6 = 0;
    local_f0 = local_78 * 0.5;
    dVar17 = 0.0;
    iVar8 = 0;
    local_e8 = values;
    local_e0 = DrawList;
    local_d8 = fmt;
    local_c8 = scale_min;
    local_c0 = dVar9;
    local_b8 = dVar14;
    dStack_b0 = dVar15;
    dStack_70 = local_78;
    local_68 = auVar13;
    do {
      if (0 < cols) {
        local_98 = local_78 * dVar17 + local_f0;
        local_a8._0_8_ = local_e8 + iVar6;
        dVar18 = 0.0;
        lVar7 = 0;
        do {
          dVar16 = dVar18 * auVar13._0_8_ + bounds_min->x + dVar11 * 0.5;
          dVar10 = bounds_max->y - local_98;
          pIVar3 = GImPlot->CurrentPlot;
          IVar1 = GImPlot->PixelRange[transformer.YAxis].Min;
          dVar2 = (pIVar3->XAxis).Range.Min;
          local_f8.x = (float)(GImPlot->Mx * ((dVar16 - dVar14) - dVar2) + (double)IVar1.x);
          local_f8.y = (float)(GImPlot->My[transformer.YAxis] *
                               ((dVar10 - dVar15) - pIVar3->YAxis[transformer.YAxis].Range.Min) +
                              (double)IVar1.y);
          IVar1 = GImPlot->PixelRange[transformer.YAxis].Min;
          local_80.x = (float)(GImPlot->Mx * ((dVar14 + dVar16) - dVar2) + (double)IVar1.x);
          local_80.y = (float)(GImPlot->My[transformer.YAxis] *
                               ((dVar15 + dVar10) - pIVar3->YAxis[transformer.YAxis].Range.Min) +
                              (double)IVar1.y);
          IVar19 = LerpColormap((float)(((double)(int)*(short *)(local_a8._0_8_ + lVar7 * 2) -
                                        scale_min) / dVar9 + 0.0));
          local_58 = IVar19._0_12_;
          fStack_4c = IVar19.w * (pIVar4->Style).FillAlpha;
          col = ImGui::GetColorU32((ImVec4 *)local_58);
          ImDrawList::AddRectFilled(DrawList,&local_f8,&local_80,col,0.0,0xf);
          dVar18 = dVar18 + 1.0;
          lVar7 = lVar7 + 1;
          dVar9 = local_c0;
          auVar13 = local_68;
          dVar14 = local_b8;
          dVar15 = dStack_b0;
          scale_min = local_c8;
        } while ((int)local_d0 != (int)lVar7);
        iVar6 = iVar6 + (int)lVar7;
        fmt = local_d8;
      }
      dVar17 = dVar17 + 1.0;
      iVar8 = iVar8 + 1;
    } while (iVar8 != rows);
    if (fmt != (char *)0x0 && 0 < rows) {
      dVar9 = auVar13._0_8_;
      iVar6 = 0;
      dVar14 = 0.0;
      iVar8 = 0;
      do {
        psVar5 = local_e8;
        if (0 < cols) {
          local_b8 = local_78 * dVar14 + local_f0;
          dVar15 = 0.0;
          lVar7 = 0;
          do {
            IVar1 = GImPlot->PixelRange[transformer.YAxis].Min;
            local_98._0_4_ =
                 (float)(GImPlot->Mx *
                         ((dVar15 * auVar13._0_8_ + bounds_min->x + dVar9 * 0.5) -
                         (GImPlot->CurrentPlot->XAxis).Range.Min) + (double)IVar1.x);
            local_98._4_4_ =
                 (float)(GImPlot->My[transformer.YAxis] *
                         (((bounds_min->y + 1.0) - local_b8) -
                         GImPlot->CurrentPlot->YAxis[transformer.YAxis].Range.Min) + (double)IVar1.y
                        );
            uStack_90 = 0;
            sprintf(local_58,fmt,(ulong)(uint)(int)psVar5[iVar6 + lVar7]);
            IVar1 = ImGui::CalcTextSize(local_58,(char *)0x0,false,-1.0);
            local_a8._8_4_ = extraout_XMM0_Dc;
            local_a8._0_4_ = IVar1.x;
            local_a8._4_4_ = IVar1.y;
            local_a8._12_4_ = extraout_XMM0_Dd;
            IVar19 = LerpColormap((float)(((double)(int)psVar5[iVar6 + lVar7] - local_c8) / local_c0
                                         + 0.0));
            local_f8.y = (float)local_a8._4_4_ * -0.5 + local_98._4_4_;
            local_f8.x = (float)local_a8._0_4_ * -0.5 + (float)local_98;
            ImDrawList::AddText(local_e0,&local_f8,
                                -(uint)(IVar19.z * 0.114 + IVar19.x * 0.299 + IVar19.y * 0.587 <=
                                       0.5) | 0xff000000,local_58,(char *)0x0);
            dVar15 = dVar15 + 1.0;
            lVar7 = lVar7 + 1;
            fmt = local_d8;
            auVar13 = local_68;
          } while ((int)local_d0 != (int)lVar7);
          iVar6 = iVar6 + (int)lVar7;
        }
        dVar14 = dVar14 + 1.0;
        iVar8 = iVar8 + 1;
      } while (iVar8 != rows);
    }
  }
  return;
}

Assistant:

void RenderHeatmap(Transformer transformer, ImDrawList& DrawList, const T* values, int rows, int cols, double scale_min, double scale_max, const char* fmt, const ImPlotPoint& bounds_min, const ImPlotPoint& bounds_max) {
    ImPlotContext& gp = *GImPlot;
    const double w = (bounds_max.x - bounds_min.x) / cols;
    const double h = (bounds_max.y - bounds_min.y) / rows;
    const ImPlotPoint half_size(w*0.5,h*0.5);
    int i = 0;
    for (int r = 0; r < rows; ++r) {
        for (int c = 0; c < cols; ++c) {
            ImPlotPoint p;
            p.x = bounds_min.x + 0.5*w + c*w;
            p.y = bounds_max.y - (0.5*h + r*h);
            ImVec2 a  = transformer(ImPlotPoint(p.x - half_size.x, p.y - half_size.y));
            ImVec2 b  = transformer(ImPlotPoint(p.x + half_size.x, p.y + half_size.y));
            double t = ImRemap((double)values[i], scale_min, scale_max, 0.0, 1.0);
            ImVec4 color = LerpColormap((float)t);
            color.w *= gp.Style.FillAlpha;
            ImU32 col = ImGui::GetColorU32(color);
            DrawList.AddRectFilled(a, b, col);
            i++;
        }
    }
    if (fmt != NULL) {
        i = 0;
        for (int r = 0; r < rows; ++r) {
            for (int c = 0; c < cols; ++c) {
                ImPlotPoint p;
                p.x = bounds_min.x + 0.5*w + c*w;
                p.y = bounds_min.y + 1 - (0.5*h + r*h);
                ImVec2 px = transformer(p);
                char buff[32];
                sprintf(buff, fmt, values[i]);
                ImVec2 size = ImGui::CalcTextSize(buff);
                double t = ImRemap((double)values[i], scale_min, scale_max, 0.0, 1.0);
                ImVec4 color = LerpColormap((float)t);
                ImU32 col = CalcTextColor(color);
                DrawList.AddText(px - size * 0.5f, col, buff);
                i++;
            }
        }
    }
}